

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O2

spv_result_t
spvOptimizerRun(spv_optimizer_t *optimizer,uint32_t *binary,size_t word_count,
               spv_binary *optimized_binary,spv_optimizer_options options)

{
  pointer __src;
  bool bVar1;
  spv_binary psVar2;
  uint32_t *__dest;
  ulong __n;
  spv_result_t sVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> optimized;
  
  optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar1 = spvtools::Optimizer::Run((Optimizer *)optimizer,binary,word_count,&optimized,options);
  if (bVar1) {
    psVar2 = (spv_binary)operator_new(0x10);
    __src = optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
    __n = (long)optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    sVar3 = SPV_SUCCESS;
    __dest = (uint32_t *)operator_new__(-(ulong)((ulong)((long)__n >> 2) >> 0x3e != 0) | __n);
    psVar2->code = __dest;
    psVar2->wordCount = (long)__n >> 2;
    memcpy(__dest,__src,__n);
    *optimized_binary = psVar2;
  }
  else {
    sVar3 = SPV_ERROR_INTERNAL;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&optimized.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return sVar3;
}

Assistant:

SPIRV_TOOLS_EXPORT
spv_result_t spvOptimizerRun(spv_optimizer_t* optimizer,
                             const uint32_t* binary,
                             const size_t word_count,
                             spv_binary* optimized_binary,
                             const spv_optimizer_options options) {
  std::vector<uint32_t> optimized;

  if (!reinterpret_cast<spvtools::Optimizer*>(optimizer)->
      Run(binary, word_count, &optimized, options)) {
    return SPV_ERROR_INTERNAL;
  }

  auto result_binary = new spv_binary_t();
  if (!result_binary) {
      *optimized_binary = nullptr;
      return SPV_ERROR_OUT_OF_MEMORY;
  }

  result_binary->code = new uint32_t[optimized.size()];
  if (!result_binary->code) {
      delete result_binary;
      *optimized_binary = nullptr;
      return SPV_ERROR_OUT_OF_MEMORY;
  }
  result_binary->wordCount = optimized.size();

  memcpy(result_binary->code, optimized.data(),
         optimized.size() * sizeof(uint32_t));

  *optimized_binary = result_binary;

  return SPV_SUCCESS;
}